

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineApplyBuiltInTargetWithArray
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *applyInfo,
          FunctionJITTimeInfo *builtInInfo,bool *pIsInlined)

{
  code *pcVar1;
  _E _Var2;
  bool bVar3;
  uint localFuncId;
  undefined4 *puVar4;
  Opnd *pOVar5;
  ByteCodeUsesInstr *this_00;
  Instr *pIVar6;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  StackSym *pSVar7;
  SymOpnd *pSVar8;
  Opnd *pOVar9;
  Instr *argOut;
  StackSym *sym;
  Opnd *linkOpnd;
  Instr *startCall;
  Instr *builtInEndInstr;
  ByteCodeUsesInstr *useCallTargetInstr;
  Instr *local_a0;
  Instr *applyTargetLdInstr;
  Instr *applyLdInstr;
  AutoReuseOpnd autoReuseOriginalCallSrc1;
  Opnd *originalCallSrc1;
  OpCode originalCallOpcode;
  Instr *pIStack_68;
  uint argOutCount;
  Instr *arrayArgOut;
  Instr *explicitThisArgOut;
  Instr *implicitThisArgOut;
  HelperCallOpnd *helperCallOpnd;
  Instr *pIStack_40;
  BuiltinFunction builtInId;
  Instr *instrNext;
  bool *pIsInlined_local;
  FunctionJITTimeInfo *builtInInfo_local;
  FunctionJITTimeInfo *applyInfo_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  pIStack_40 = callInstr->m_next;
  localFuncId = FunctionJITTimeInfo::GetLocalFunctionId(builtInInfo);
  helperCallOpnd._7_1_ = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
  implicitThisArgOut = (Instr *)0x0;
  _Var2 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&helperCallOpnd + 7));
  if (_Var2 == Math_Max) {
    implicitThisArgOut = (Instr *)IR::HelperCallOpnd::New(HelperOp_MaxInAnArray,callInstr->m_func);
  }
  else {
    if (_Var2 != Math_Min) {
      return pIStack_40;
    }
    implicitThisArgOut = (Instr *)IR::HelperCallOpnd::New(HelperOp_MinInAnArray,callInstr->m_func);
  }
  explicitThisArgOut = (Instr *)0x0;
  arrayArgOut = (Instr *)0x0;
  pIStack_68 = (Instr *)0x0;
  originalCallSrc1._4_4_ = 0;
  GetArgInstrsForCallAndApply
            (this,callInstr,&explicitThisArgOut,&arrayArgOut,&stack0xffffffffffffff98,
             (uint *)((long)&originalCallSrc1 + 4));
  if (explicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa83,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (arrayArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa84,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (pIStack_68 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa85,"(arrayArgOut)","arrayArgOut");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  originalCallSrc1._2_2_ = callInstr->m_opcode;
  pOVar5 = IR::Instr::GetSrc1(callInstr);
  autoReuseOriginalCallSrc1._16_8_ = IR::Opnd::Copy(pOVar5,this->topFunc);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&applyLdInstr,(Opnd *)autoReuseOriginalCallSrc1._16_8_,this->topFunc,
             true);
  applyTargetLdInstr = (Instr *)0x0;
  local_a0 = (Instr *)0x0;
  bVar3 = TryGetCallApplyAndTargetLdInstrs(this,callInstr,&applyTargetLdInstr,&local_a0);
  if (bVar3) {
    *pIsInlined = true;
    pOVar5 = IR::Instr::GetDst(local_a0);
    IR::Instr::ReplaceSrc1(callInstr,pOVar5);
    this_00 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                        (this,callInstr,callInstr,builtInInfo,false,true,false,true);
    if (this_00 != (ByteCodeUsesInstr *)0x0) {
      IR::Instr::Remove(&this_00->super_Instr);
    }
    callInstr->m_opcode = originalCallSrc1._2_2_;
    IR::Instr::ReplaceSrc1(callInstr,(Opnd *)autoReuseOriginalCallSrc1._16_8_);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns
              (this,callInstr,callInstr,applyInfo,false,true,false,true);
    pIVar6 = InsertInlineeBuiltInStartEndTags(this,callInstr,3,(Instr **)0x0);
    pIVar6->m_opcode = InlineNonTrackingBuiltInEnd;
    dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
    src1Opnd = IR::IntConstOpnd::New(2,TyInt32,callInstr->m_func,false);
    pIVar6 = IR::Instr::New(StartCall,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
    pSVar8 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
    pOVar5 = IR::Instr::GetSrc1(arrayArgOut);
    pOVar9 = IR::Instr::GetDst(pIVar6);
    pIVar6 = IR::Instr::New(ArgOut_A,&pSVar8->super_Opnd,pOVar5,pOVar9,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,2);
    pSVar8 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
    pOVar5 = IR::Instr::GetSrc1(pIStack_68);
    pOVar9 = IR::Instr::GetDst(pIVar6);
    pIVar6 = IR::Instr::New(ArgOut_A,&pSVar8->super_Opnd,pOVar5,pOVar9,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
    pSVar8 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyUint64,callInstr->m_func);
    pOVar5 = IR::Instr::GetSrc1(explicitThisArgOut);
    pOVar9 = IR::Instr::GetDst(pIVar6);
    pIVar6 = IR::Instr::New(ArgOut_A_InlineSpecialized,&pSVar8->super_Opnd,pOVar5,pOVar9,
                            callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    callInstr->m_opcode = CallDirect;
    IR::Instr::ReplaceSrc1(callInstr,(Opnd *)implicitThisArgOut);
    pOVar5 = IR::Instr::GetDst(pIVar6);
    IR::Instr::ReplaceSrc2(callInstr,pOVar5);
  }
  pIVar6 = pIStack_40;
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&applyLdInstr);
  return pIVar6;
}

Assistant:

IR::Instr * Inline::InlineApplyBuiltInTargetWithArray(IR::Instr * callInstr, const FunctionJITTimeInfo * applyInfo, const FunctionJITTimeInfo * builtInInfo, bool * pIsInlined)
{
    IR::Instr * instrNext = callInstr->m_next;
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(builtInInfo->GetLocalFunctionId());
    IR::HelperCallOpnd * helperCallOpnd = nullptr;
    switch (builtInId)
    {
    case Js::BuiltinFunction::Math_Max:
        helperCallOpnd = IR::HelperCallOpnd::New(IR::HelperOp_MaxInAnArray, callInstr->m_func);
        break;

    case Js::BuiltinFunction::Math_Min:
        helperCallOpnd = IR::HelperCallOpnd::New(IR::HelperOp_MinInAnArray, callInstr->m_func);
        break;

    default:
        return instrNext;
    }

    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * arrayArgOut = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &arrayArgOut, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);
    Assert(arrayArgOut);
    Js::OpCode originalCallOpcode = callInstr->m_opcode;
    IR::Opnd * originalCallSrc1 = callInstr->GetSrc1()->Copy(this->topFunc);
    IR::AutoReuseOpnd autoReuseOriginalCallSrc1(originalCallSrc1, this->topFunc);

    IR::Instr* applyLdInstr = nullptr;
    IR::Instr* applyTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &applyLdInstr, &applyTargetLdInstr))
    {
        return instrNext;
    }

    *pIsInlined = true;
    // Fixed function/function object checks for target built-in
    callInstr->ReplaceSrc1(applyTargetLdInstr->GetDst());
    {
        IR::ByteCodeUsesInstr * useCallTargetInstr =
            EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, builtInInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);
        if (useCallTargetInstr)
        {
            // The applyTarget dst already has a use in the argout, this bytecode use is not valid
            useCallTargetInstr->Remove();
        }
    }

    // Fixed function/function object checks for .apply
    callInstr->m_opcode = originalCallOpcode;
    callInstr->ReplaceSrc1(originalCallSrc1);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, applyInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr* builtInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, 3); // 3 args (implicit this + explicit this + array = 3)
    builtInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd; // We will call EndTrackCall when we see CallDirect for reasons explained in GlobOpt::TrackCalls

    IR::Instr * startCall = IR::Instr::New(Js::OpCode::StartCall,
                                           IR::RegOpnd::New(TyVar, callInstr->m_func),
                                           IR::IntConstOpnd::New(2, TyInt32, callInstr->m_func),
                                           callInstr->m_func);
    callInstr->InsertBefore(startCall);

    IR::Opnd * linkOpnd;
    StackSym * sym;

    sym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    linkOpnd = IR::SymOpnd::New(sym, 0, TyVar, callInstr->m_func);
    IR::Instr * argOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, explicitThisArgOut->GetSrc1(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    sym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(2));
    linkOpnd = IR::SymOpnd::New(sym, 0, TyVar, callInstr->m_func);
    argOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, arrayArgOut->GetSrc1(), argOut->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    linkOpnd = IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1)), 0, TyMachPtr, callInstr->m_func);
    argOut = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, linkOpnd, implicitThisArgOut->GetSrc1(), argOut->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    callInstr->m_opcode = Js::OpCode::CallDirect;
    callInstr->ReplaceSrc1(helperCallOpnd);
    callInstr->ReplaceSrc2(argOut->GetDst());

    return instrNext;
}